

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

VoidPromiseAndPipeline * __thiscall
capnp::LocalClient::call
          (VoidPromiseAndPipeline *__return_storage_ptr__,LocalClient *this,uint64_t interfaceId,
          uint16_t methodId,Own<capnp::CallContextHook> *context)

{
  Type *func;
  CallContextHook *pCVar1;
  Promise<void> *pPVar2;
  Promise<kj::Own<capnp::PipelineHook>_> *params;
  Own<capnp::QueuedPipeline> local_160;
  Own<capnp::CallContextHook> local_150;
  undefined1 local_140 [8];
  Promise<void> completionPromise;
  PropagateException local_119;
  Promise<capnp::AnyPointer::Pipeline> local_118;
  undefined1 local_108 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:490:59),_capnp::AnyPointer::Pipeline>
  tailPipelinePromise;
  Own<capnp::CallContextHook> local_f0;
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:485:9),_kj::Own<capnp::CallContextHook>_>
  local_e0;
  undefined1 local_c8 [24];
  PromiseForResult<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:485:9),_kj::Own<capnp::CallContextHook>_>,_void>
  pipelinePromise;
  ForkedPromise<void> forked;
  Own<capnp::LocalClient> local_88;
  Type local_78;
  Own<capnp::LocalClient> local_58;
  undefined1 local_48 [8];
  Promise<void> promise;
  CallContextHook *contextPtr;
  Own<capnp::CallContextHook> *context_local;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  LocalClient *this_local;
  
  func = (Type *)kj::Own<capnp::CallContextHook>::get(context);
  local_78.this = this;
  local_78.interfaceId = interfaceId;
  local_78.methodId = methodId;
  local_78.contextPtr = (CallContextHook *)func;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)func;
  kj::
  evalLater<capnp::LocalClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda()_1_>
            ((kj *)&local_58,&local_78);
  kj::addRef<capnp::LocalClient>((kj *)&local_88,this);
  kj::Promise<void>::attach<kj::Own<capnp::LocalClient>>((Promise<void> *)local_48,&local_58);
  kj::Own<capnp::LocalClient>::~Own(&local_88);
  kj::Promise<void>::~Promise((Promise<void> *)&local_58);
  kj::Promise<void>::fork((Promise<void> *)&pipelinePromise.super_PromiseBase.node.ptr);
  kj::ForkedPromise<void>::addBranch((ForkedPromise<void> *)local_c8);
  pCVar1 = kj::Own<capnp::CallContextHook>::operator->(context);
  (*pCVar1->_vptr_CallContextHook[7])(&local_f0);
  kj::
  mvCapture<capnp::LocalClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::CallContextHook>&&)_1_,kj::Own<capnp::CallContextHook>>
            (&local_e0,(kj *)&local_f0,
             (Own<capnp::CallContextHook> *)
             ((long)&tailPipelinePromise.super_PromiseBase.node.ptr + 7),func);
  kj::Promise<void>::
  then<kj::CaptureByMove<capnp::LocalClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::CallContextHook>&&)_1_,kj::Own<capnp::CallContextHook>>,kj::_::PropagateException>
            ((Promise<void> *)(local_c8 + 0x10),
             (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:485:9),_kj::Own<capnp::CallContextHook>_>
              *)local_c8,(PropagateException *)&local_e0);
  kj::
  CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++:485:9),_kj::Own<capnp::CallContextHook>_>
  ::~CaptureByMove(&local_e0);
  kj::Own<capnp::CallContextHook>::~Own(&local_f0);
  kj::Promise<void>::~Promise((Promise<void> *)local_c8);
  pCVar1 = kj::Own<capnp::CallContextHook>::operator->(context);
  (*pCVar1->_vptr_CallContextHook[5])(&local_118);
  kj::Promise<capnp::AnyPointer::Pipeline>::
  then<capnp::LocalClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(capnp::AnyPointer::Pipeline&&)_1_,kj::_::PropagateException>
            ((Promise<capnp::AnyPointer::Pipeline> *)local_108,(Type *)&local_118,&local_119);
  kj::Promise<capnp::AnyPointer::Pipeline>::~Promise(&local_118);
  kj::mv<kj::Promise<kj::Own<capnp::PipelineHook>>>
            ((Promise<kj::Own<capnp::PipelineHook>_> *)local_108);
  kj::Promise<kj::Own<capnp::PipelineHook>_>::exclusiveJoin
            ((Promise<kj::Own<capnp::PipelineHook>_> *)&completionPromise.super_PromiseBase.node.ptr
             ,(Promise<kj::Own<capnp::PipelineHook>_> *)(local_c8 + 0x10));
  kj::Promise<kj::Own<capnp::PipelineHook>_>::operator=
            ((Promise<kj::Own<capnp::PipelineHook>_> *)(local_c8 + 0x10),
             (Promise<kj::Own<capnp::PipelineHook>_> *)&completionPromise.super_PromiseBase.node.ptr
            );
  kj::Promise<kj::Own<capnp::PipelineHook>_>::~Promise
            ((Promise<kj::Own<capnp::PipelineHook>_> *)&completionPromise.super_PromiseBase.node.ptr
            );
  kj::ForkedPromise<void>::addBranch((ForkedPromise<void> *)&local_150);
  kj::mv<kj::Own<capnp::CallContextHook>>(context);
  kj::Promise<void>::attach<kj::Own<capnp::CallContextHook>>((Promise<void> *)local_140,&local_150);
  kj::Promise<void>::~Promise((Promise<void> *)&local_150);
  pPVar2 = kj::mv<kj::Promise<void>>((Promise<void> *)local_140);
  kj::Promise<void>::Promise(&__return_storage_ptr__->promise,pPVar2);
  params = kj::mv<kj::Promise<kj::Own<capnp::PipelineHook>>>
                     ((Promise<kj::Own<capnp::PipelineHook>_> *)(local_c8 + 0x10));
  kj::refcounted<capnp::QueuedPipeline,kj::Promise<kj::Own<capnp::PipelineHook>>>
            ((kj *)&local_160,params);
  kj::Own<capnp::PipelineHook>::Own<capnp::QueuedPipeline,void>
            (&__return_storage_ptr__->pipeline,&local_160);
  kj::Own<capnp::QueuedPipeline>::~Own(&local_160);
  kj::Promise<void>::~Promise((Promise<void> *)local_140);
  kj::Promise<kj::Own<capnp::PipelineHook>_>::~Promise
            ((Promise<kj::Own<capnp::PipelineHook>_> *)local_108);
  kj::Promise<kj::Own<capnp::PipelineHook>_>::~Promise
            ((Promise<kj::Own<capnp::PipelineHook>_> *)(local_c8 + 0x10));
  kj::ForkedPromise<void>::~ForkedPromise
            ((ForkedPromise<void> *)&pipelinePromise.super_PromiseBase.node.ptr);
  kj::Promise<void>::~Promise((Promise<void> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

VoidPromiseAndPipeline call(uint64_t interfaceId, uint16_t methodId,
                              kj::Own<CallContextHook>&& context) override {
    auto contextPtr = context.get();

    // We don't want to actually dispatch the call synchronously, because we don't want the callee
    // to have any side effects before the promise is returned to the caller.  This helps avoid
    // race conditions.
    //
    // So, we do an evalLater() here.
    //
    // Note also that QueuedClient depends on this evalLater() to ensure that pipelined calls don't
    // complete before 'whenMoreResolved()' promises resolve.
    auto promise = kj::evalLater([this,interfaceId,methodId,contextPtr]() {
      return server->dispatchCall(interfaceId, methodId,
                                  CallContext<AnyPointer, AnyPointer>(*contextPtr));
    }).attach(kj::addRef(*this));

    // We have to fork this promise for the pipeline to receive a copy of the answer.
    auto forked = promise.fork();

    auto pipelinePromise = forked.addBranch().then(kj::mvCapture(context->addRef(),
        [=](kj::Own<CallContextHook>&& context) -> kj::Own<PipelineHook> {
          context->releaseParams();
          return kj::refcounted<LocalPipeline>(kj::mv(context));
        }));

    auto tailPipelinePromise = context->onTailCall().then([](AnyPointer::Pipeline&& pipeline) {
      return kj::mv(pipeline.hook);
    });

    pipelinePromise = pipelinePromise.exclusiveJoin(kj::mv(tailPipelinePromise));

    auto completionPromise = forked.addBranch().attach(kj::mv(context));

    return VoidPromiseAndPipeline { kj::mv(completionPromise),
        kj::refcounted<QueuedPipeline>(kj::mv(pipelinePromise)) };
  }